

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_token.cpp
# Opt level: O0

TOKEN __thiscall CNetTokenCache::GetToken(CNetTokenCache *this,NETADDR *pAddr)

{
  int iVar1;
  TStaticRingBuffer<CNetTokenCache::CAddressInfo,_2560,_1> *this_00;
  NETADDR *in_RSI;
  CAddressInfo *in_RDI;
  CAddressInfo *pInfo;
  
  this_00 = (TStaticRingBuffer<CNetTokenCache::CAddressInfo,_2560,_1> *)
            TStaticRingBuffer<CNetTokenCache::CAddressInfo,_2560,_1>::Last
                      ((TStaticRingBuffer<CNetTokenCache::CAddressInfo,_2560,_1> *)0x24a250);
  while( true ) {
    if (this_00 == (TStaticRingBuffer<CNetTokenCache::CAddressInfo,_2560,_1> *)0x0) {
      return 0xffffffff;
    }
    iVar1 = net_addr_comp(in_RSI,(NETADDR *)this_00,(int)((ulong)in_RDI >> 0x20));
    if (iVar1 == 0) break;
    this_00 = (TStaticRingBuffer<CNetTokenCache::CAddressInfo,_2560,_1> *)
              TStaticRingBuffer<CNetTokenCache::CAddressInfo,_2560,_1>::Prev(this_00,in_RDI);
  }
  return *(TOKEN *)&(this_00->super_CRingBufferBase).m_pLast;
}

Assistant:

TOKEN CNetTokenCache::GetToken(const NETADDR *pAddr)
{
	// traverse the list in the reverse direction
	// newest caches are the best
	CAddressInfo *pInfo = m_TokenCache.Last();
	while(pInfo)
	{
		if(net_addr_comp(&pInfo->m_Addr, pAddr, true) == 0)
			return pInfo->m_Token;
		pInfo = m_TokenCache.Prev(pInfo);
	}
	return NET_TOKEN_NONE;
}